

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O0

vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
DiffSectorCopies(vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
                 *__return_storage_ptr__,Sector *sector)

{
  bool bVar1;
  int iVar2;
  DataList *pDVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  difference_type dVar6;
  long *plVar7;
  pair<char,_long> pVar8;
  pair<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pVar9;
  char local_281;
  pair<char,_int> local_280;
  pair<char,_unsigned_long> local_278;
  char local_261;
  pair<char,_long> local_260;
  pair<char,_unsigned_long> local_250;
  char local_239;
  pair<char,_int> local_238;
  pair<char,_unsigned_long> local_230;
  uchar *local_220;
  uchar *local_218;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_210;
  uchar *local_208;
  long local_200;
  difference_type offset2_1;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1f0;
  uchar *local_1e8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1d0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  pair<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pair_1;
  Data *data_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  DataList *__range2_1;
  long local_170;
  difference_type match;
  uchar *local_160;
  char local_151;
  pair<char,_long> local_150;
  pair<char,_unsigned_long> local_140;
  char local_129;
  pair<char,_int> local_128;
  pair<char,_unsigned_long> local_120;
  uchar *local_110;
  uchar *local_108;
  uchar *local_100;
  difference_type local_f8;
  difference_type offset2;
  uchar *local_e8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_e0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_d8;
  uchar *local_d0;
  pair<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pair;
  Data *data;
  const_iterator __end2;
  const_iterator __begin2;
  DataList *__range2;
  long local_90;
  difference_type same;
  uchar *local_80;
  difference_type local_78;
  difference_type offset;
  int diff;
  int change_count;
  const_iterator itEnd;
  const_iterator it;
  __normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_> local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  Data *smallest;
  Sector *local_18;
  Sector *sector_local;
  vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *diffs;
  
  local_18 = sector;
  sector_local = (Sector *)__return_storage_ptr__;
  iVar2 = Sector::copies(sector);
  if (iVar2 < 1) {
    __assert_fail("sector.copies() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp"
                  ,0x2a0,"std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector &)");
  }
  smallest._7_1_ = 0;
  std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>::
  vector(__return_storage_ptr__);
  pDVar3 = Sector::datas(local_18);
  cVar4 = std::vector<Data,_std::allocator<Data>_>::begin(pDVar3);
  pDVar3 = Sector::datas(local_18);
  cVar5 = std::vector<Data,_std::allocator<Data>_>::end(pDVar3);
  local_30 = std::
             min_element<__gnu_cxx::__normal_iterator<Data_const*,std::vector<Data,std::allocator<Data>>>,DiffSectorCopies(Sector_const&)::__0>
                       (cVar4._M_current,cVar5._M_current);
  local_28 = &__gnu_cxx::__normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>
              ::operator*(&local_30)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  itEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_28);
  _diff = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(local_28);
  offset._4_4_ = 0;
  offset._0_4_ = 0;
  while (bVar1 = __gnu_cxx::operator<
                           (&itEnd,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                    *)&diff), bVar1) {
    local_80 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_28);
    same = (difference_type)itEnd._M_current;
    local_78 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_80,
                          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )itEnd._M_current);
    local_90 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )itEnd._M_current,
                          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )_diff);
    pDVar3 = Sector::datas(local_18);
    __end2 = std::vector<Data,_std::allocator<Data>_>::begin(pDVar3);
    data = (Data *)std::vector<Data,_std::allocator<Data>_>::end(pDVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>
                                       *)&data), bVar1) {
      pair.second._M_current =
           (uchar *)__gnu_cxx::
                    __normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                    operator*(&__end2);
      if (local_90 != 0) {
        local_d8._M_current = itEnd._M_current;
        local_e0 = __gnu_cxx::
                   __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   ::operator+(&itEnd,local_90);
        offset2 = (difference_type)
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                             pair.second._M_current);
        local_e8 = (uchar *)__gnu_cxx::
                            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                         *)&offset2,local_78);
        pVar9 = std::
                mismatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_d8,local_e0,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_e8);
        pair.first = pVar9.second._M_current;
        local_108 = (uchar *)pVar9.first._M_current;
        local_100 = itEnd._M_current;
        local_d0 = local_108;
        local_f8 = std::
                   distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                             ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )itEnd._M_current,
                              (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                               )local_108);
        plVar7 = std::min<long>(&local_90,&local_f8);
        local_90 = *plVar7;
      }
      __gnu_cxx::__normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
      operator++(&__end2);
    }
    local_110 = (uchar *)__gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&itEnd,local_90);
    itEnd._M_current = local_110;
    if ((0xf < local_90) || ((local_78 == 0 && (0 < local_90)))) {
      if ((int)offset != 0) {
        offset._4_4_ = offset._4_4_ + 1;
        local_129 = '-';
        local_128 = std::make_pair<char,int&>(&local_129,(int *)&offset);
        std::pair<char,_unsigned_long>::pair<char,_int,_true>(&local_120,&local_128);
        std::
        vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>::
        push_back(__return_storage_ptr__,&local_120);
        offset._0_4_ = 0;
      }
      offset._4_4_ = offset._4_4_ + 1;
      local_151 = '=';
      pVar8 = std::make_pair<char,long&>(&local_151,&local_90);
      local_150.second = pVar8.second;
      local_150.first = pVar8.first;
      std::pair<char,_unsigned_long>::pair<char,_long,_true>(&local_140,&local_150);
      std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
      ::push_back(__return_storage_ptr__,&local_140);
      local_90 = 0;
    }
    local_160 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(local_28)
    ;
    match = (difference_type)itEnd._M_current;
    local_78 = std::
               distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                         ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )local_160,
                          (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                           )itEnd._M_current);
    local_170 = std::
                distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )itEnd._M_current,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )_diff);
    pDVar3 = Sector::datas(local_18);
    __end2_1 = std::vector<Data,_std::allocator<Data>_>::begin(pDVar3);
    data_1 = (Data *)std::vector<Data,_std::allocator<Data>_>::end(pDVar3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>
                               *)&data_1), bVar1) {
      pair_1.second._M_current =
           (uchar *)__gnu_cxx::
                    __normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
                    operator*(&__end2_1);
      if (local_170 != 0) {
        local_1c0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 pair_1.second._M_current);
        local_1b8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_1c0,local_78);
        local_1e0._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (pair_1.second._M_current);
        local_1d8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_1e0,local_78);
        local_1d0 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+(&local_1d8,local_170);
        local_1c8 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator-(&local_1d0,1);
        offset2_1 = (difference_type)
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               pair_1.second._M_current);
        local_1f0 = __gnu_cxx::
                    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    ::operator+((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                 *)&offset2_1,local_78);
        local_1e8 = (uchar *)__gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_1f0,1);
        pVar9 = std::
                mismatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (local_1b8,local_1c8,
                           (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_1e8);
        pair_1.first = pVar9.second._M_current;
        local_1b0 = pVar9.first._M_current;
        local_210._M_current =
             (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                (pair_1.second._M_current);
        local_208 = (uchar *)__gnu_cxx::
                             __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                             ::operator+(&local_210,local_78);
        local_218 = local_1b0._M_current;
        dVar6 = std::
                distance<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )local_208,local_1b0);
        local_200 = dVar6 + 1;
        plVar7 = std::min<long>(&local_170,&local_200);
        local_170 = *plVar7;
      }
      __gnu_cxx::__normal_iterator<const_Data_*,_std::vector<Data,_std::allocator<Data>_>_>::
      operator++(&__end2_1);
    }
    local_220 = (uchar *)__gnu_cxx::
                         __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         ::operator+(&itEnd,local_170);
    itEnd._M_current = local_220;
    if (0xf < local_170) {
      if ((int)offset != 0) {
        offset._4_4_ = offset._4_4_ + 1;
        local_239 = '-';
        local_238 = std::make_pair<char,int&>(&local_239,(int *)&offset);
        std::pair<char,_unsigned_long>::pair<char,_int,_true>(&local_230,&local_238);
        std::
        vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>::
        push_back(__return_storage_ptr__,&local_230);
        offset._0_4_ = 0;
      }
      offset._4_4_ = offset._4_4_ + 1;
      local_261 = '+';
      pVar8 = std::make_pair<char,long&>(&local_261,&local_170);
      local_260.second = pVar8.second;
      local_260.first = pVar8.first;
      std::pair<char,_unsigned_long>::pair<char,_long,_true>(&local_250,&local_260);
      std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
      ::push_back(__return_storage_ptr__,&local_250);
      local_170 = 0;
    }
    offset._0_4_ = (int)local_90 + (int)local_170 + (int)offset;
  }
  if ((int)offset != 0) {
    offset._4_4_ = offset._4_4_ + 1;
    local_281 = '-';
    local_280 = std::make_pair<char,int&>(&local_281,(int *)&offset);
    std::pair<char,_unsigned_long>::pair<char,_int,_true>(&local_278,&local_280);
    std::vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>::
    push_back(__return_storage_ptr__,&local_278);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector& sector)
{
    assert(sector.copies() > 0);
    std::vector<std::pair<char, size_t>> diffs;

    auto& smallest = *std::min_element(
        sector.datas().begin(), sector.datas().end(),
        [](const Data& d1, const Data& d2) {
            return d1.size() < d2.size();
        }
    );
    auto it = smallest.begin();
    auto itEnd = smallest.end();

    //  int extent = pt_->GetDataExtent(nSector_);  // ToDo
    auto change_count = 0;

    auto diff = 0;
    while (it < itEnd)
    {
        auto offset = std::distance(smallest.begin(), it);
        auto same = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (same)
            {
                // Find the prefix length where all data copies match
                auto pair = std::mismatch(it, it + same, data.begin() + offset);
                auto offset2 = std::distance(it, pair.first);
                same = std::min(same, offset2);
            }
        }
        it = it + same;

        // Show the matching block if big enough or if found
        // at the start of the data field. Other fragments will
        // be added to the diff block.
        if (same >= MIN_DIFF_BLOCK || (offset == 0 && same > 0))
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('=', same));
            same = 0;
        }

        offset = std::distance(smallest.begin(), it);
        auto match = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (match)
            {
                // Find the prefix length where each copy has matching filler
                auto pair = std::mismatch(data.begin() + offset, data.begin() + offset + match - 1, data.begin() + offset + 1);
                auto offset2 = 1 + std::distance(data.begin() + offset, pair.first);
                match = std::min(match, offset2);
            }
        }
        it = it + match;

        // Show the filler block if big enough. Filler has matching
        // bytes in each copy, but a different value across copies.
        if (match >= MIN_DIFF_BLOCK)
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('+', match));
            match = 0;
        }

        diff += static_cast<int>(same + match);
    }

    if (diff)
    {
        ++change_count;
        diffs.push_back(std::make_pair('-', diff));
    }

    return diffs;
}